

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeConditionalWrapper.cpp
# Opt level: O1

Statement * __thiscall
IRT::RelativeConditionalWrapper::ToConditional
          (RelativeConditionalWrapper *this,Label *true_label,Label *false_label)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogicOperatorType type;
  Expression *left;
  Expression *right;
  pointer pcVar2;
  JumpConditionalStatement *pJVar3;
  Label local_78;
  Label local_58;
  JumpConditionalStatement *local_38;
  
  local_38 = (JumpConditionalStatement *)operator_new(0x60);
  type = this->operator_type_;
  left = this->lhs_;
  right = this->rhs_;
  local_58.label_._M_dataplus._M_p = (pointer)&local_58.label_.field_2;
  pcVar2 = (true_label->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (true_label->label_)._M_string_length);
  paVar1 = &local_78.label_.field_2;
  pcVar2 = (false_label->label_)._M_dataplus._M_p;
  local_78.label_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + (false_label->label_)._M_string_length);
  pJVar3 = local_38;
  JumpConditionalStatement::JumpConditionalStatement(local_38,type,left,right,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.label_._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.label_._M_dataplus._M_p,
                    local_78.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.label_._M_dataplus._M_p != &local_58.label_.field_2) {
    operator_delete(local_58.label_._M_dataplus._M_p,
                    local_58.label_.field_2._M_allocated_capacity + 1);
  }
  return &pJVar3->super_Statement;
}

Assistant:

Statement *RelativeConditionalWrapper::ToConditional(Label true_label, Label false_label) {
    return new JumpConditionalStatement(
        operator_type_,
        lhs_,
        rhs_,
        true_label,
        false_label
    );
}